

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_obj_loader.h
# Opt level: O2

bool __thiscall
tinyobj::ObjReader::ParseFromString
          (ObjReader *this,string *obj_text,string *mtl_text,ObjReaderConfig *config)

{
  ObjReader OVar1;
  MaterialStreamReader mtl_ss;
  stringbuf mtl_buf;
  stringbuf obj_buf;
  istream obj_ifs;
  istream mtl_ifs;
  
  std::__cxx11::stringbuf::stringbuf((stringbuf *)&obj_buf,(string *)obj_text,_S_out|_S_in);
  std::__cxx11::stringbuf::stringbuf((stringbuf *)&mtl_buf,(string *)mtl_text,_S_out|_S_in);
  std::istream::istream(&obj_ifs,(streambuf *)&obj_buf);
  std::istream::istream(&mtl_ifs,(streambuf *)&mtl_buf);
  mtl_ss.super_MaterialReader._vptr_MaterialReader = (_func_int **)&PTR__MaterialReader_0012ad70;
  mtl_ss.m_inStream = &mtl_ifs;
  OVar1 = (ObjReader)
          LoadObj((attrib_t *)(this + 8),
                  (vector<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_> *)(this + 0x98),
                  (vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_> *)(this + 0xb0)
                  ,(string *)(this + 200),(string *)(this + 0xe8),&obj_ifs,
                  &mtl_ss.super_MaterialReader,(bool)*config,(bool)config[1]);
  *this = OVar1;
  std::istream::~istream(&mtl_ifs);
  std::istream::~istream(&obj_ifs);
  std::__cxx11::stringbuf::~stringbuf((stringbuf *)&mtl_buf);
  std::__cxx11::stringbuf::~stringbuf((stringbuf *)&obj_buf);
  return (bool)OVar1;
}

Assistant:

bool ObjReader::ParseFromString(const std::string &obj_text,
                                const std::string &mtl_text,
                                const ObjReaderConfig &config) {
  std::stringbuf obj_buf(obj_text);
  std::stringbuf mtl_buf(mtl_text);

  std::istream obj_ifs(&obj_buf);
  std::istream mtl_ifs(&mtl_buf);

  MaterialStreamReader mtl_ss(mtl_ifs);

  valid_ = LoadObj(&attrib_, &shapes_, &materials_, &warning_, &error_,
                   &obj_ifs, &mtl_ss, config.triangulate, config.vertex_color);

  return valid_;
}